

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O3

int USHAReset(USHAContext *ctx,SHAversion whichSha)

{
  int iVar1;
  
  if (ctx != (USHAContext *)0x0) {
    ctx->whichSha = whichSha;
    switch(whichSha) {
    case SHA1:
      iVar1 = SHA1Reset(&(ctx->ctx).sha1Context);
      return iVar1;
    case SHA224:
      iVar1 = SHA224Reset(&(ctx->ctx).sha224Context);
      return iVar1;
    case SHA256:
      iVar1 = SHA256Reset(&(ctx->ctx).sha256Context);
      return iVar1;
    case SHA384:
      iVar1 = SHA384Reset(&(ctx->ctx).sha384Context);
      return iVar1;
    case SHA512:
      iVar1 = SHA512Reset(&(ctx->ctx).sha512Context);
      return iVar1;
    default:
      return 4;
    }
  }
  return 1;
}

Assistant:

int USHAReset(USHAContext *ctx, enum SHAversion whichSha)
{
    if (ctx) {
        ctx->whichSha = whichSha;
        switch (whichSha) {
        case SHA1:   return SHA1Reset((SHA1Context*)&ctx->ctx);
        case SHA224: return SHA224Reset((SHA224Context*)&ctx->ctx);
        case SHA256: return SHA256Reset((SHA256Context*)&ctx->ctx);
        case SHA384: return SHA384Reset((SHA384Context*)&ctx->ctx);
        case SHA512: return SHA512Reset((SHA512Context*)&ctx->ctx);
        default: return shaBadParam;
        }
    }
    else {
        return shaNull;
    }
}